

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

void __thiscall Assimp::Ogre::MeshXml::ConvertToAssimpScene(MeshXml *this,aiScene *dest)

{
  uint uVar1;
  pointer ppAVar2;
  pointer ppAVar3;
  aiMesh **ppaVar4;
  aiNode *paVar5;
  uint *puVar6;
  aiMesh *paVar7;
  aiNode **ppaVar8;
  aiAnimation **ppaVar9;
  aiAnimation *paVar10;
  Skeleton *this_00;
  ulong uVar11;
  long lVar12;
  long lVar13;
  pointer ppBVar14;
  BoneList rootBones;
  BoneList local_48;
  
  uVar11 = (long)(this->subMeshes).
                 super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->subMeshes).
                 super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  dest->mNumMeshes = (uint)(uVar11 >> 3);
  ppaVar4 = (aiMesh **)operator_new__(uVar11 & 0x7fffffff8);
  dest->mMeshes = ppaVar4;
  paVar5 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar5);
  dest->mRootNode = paVar5;
  uVar1 = dest->mNumMeshes;
  paVar5->mNumMeshes = uVar1;
  puVar6 = (uint *)operator_new__((ulong)uVar1 * 4);
  paVar5->mMeshes = puVar6;
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    do {
      paVar7 = SubMeshXml::ConvertToAssimpMesh
                         ((this->subMeshes).
                          super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11],this);
      dest->mMeshes[uVar11] = paVar7;
      dest->mRootNode->mMeshes[uVar11] = (uint)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 < dest->mNumMeshes);
  }
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    if ((this_00->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this_00->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Skeleton::RootBones(&local_48,this_00);
      ppBVar14 = local_48.
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)local_48.
                     super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.
                     super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      dest->mRootNode->mNumChildren = (uint)lVar12;
      paVar5 = dest->mRootNode;
      ppaVar8 = (aiNode **)operator_new__((ulong)paVar5->mNumChildren << 3);
      paVar5->mChildren = ppaVar8;
      if (local_48.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppBVar14) {
        lVar13 = 0;
        do {
          paVar5 = Bone::ConvertToAssimpNode
                             (local_48.
                              super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar13],this->skeleton,
                              dest->mRootNode);
          dest->mRootNode->mChildren[lVar13] = paVar5;
          lVar13 = lVar13 + 1;
          ppBVar14 = local_48.
                     super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar13);
      }
      if (ppBVar14 != (pointer)0x0) {
        operator_delete(ppBVar14,(long)local_48.
                                       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppBVar14);
      }
      this_00 = this->skeleton;
    }
    ppAVar2 = (this_00->animations).
              super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppAVar3 = (this_00->animations).
              super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppAVar2 != ppAVar3) {
      uVar11 = (long)ppAVar3 - (long)ppAVar2;
      dest->mNumAnimations = (uint)(uVar11 >> 3);
      ppaVar9 = (aiAnimation **)operator_new__(uVar11 & 0x7fffffff8);
      dest->mAnimations = ppaVar9;
      lVar12 = (long)(this->skeleton->animations).
                     super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->skeleton->animations).
                     super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (lVar12 != 0) {
        lVar12 = lVar12 >> 3;
        lVar13 = 0;
        do {
          paVar10 = Animation::ConvertToAssimpAnimation
                              ((this->skeleton->animations).
                               super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar13]);
          dest->mAnimations[lVar13] = paVar10;
          lVar13 = lVar13 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar13);
      }
    }
  }
  return;
}

Assistant:

void MeshXml::ConvertToAssimpScene(aiScene* dest)
{
    // Setup
    dest->mNumMeshes = static_cast<unsigned int>(NumSubMeshes());
    dest->mMeshes = new aiMesh*[dest->mNumMeshes];

    // Create root node
    dest->mRootNode = new aiNode();
    dest->mRootNode->mNumMeshes = dest->mNumMeshes;
    dest->mRootNode->mMeshes = new unsigned int[dest->mRootNode->mNumMeshes];

    // Export meshes
    for(size_t i=0; i<dest->mNumMeshes; ++i)
    {
        dest->mMeshes[i] = subMeshes[i]->ConvertToAssimpMesh(this);
        dest->mRootNode->mMeshes[i] = static_cast<unsigned int>(i);
    }

    // Export skeleton
    if (skeleton)
    {
        // Bones
        if (!skeleton->bones.empty())
        {
            BoneList rootBones = skeleton->RootBones();
            dest->mRootNode->mNumChildren = static_cast<unsigned int>(rootBones.size());
            dest->mRootNode->mChildren = new aiNode*[dest->mRootNode->mNumChildren];

            for(size_t i=0, len=rootBones.size(); i<len; ++i)
            {
                dest->mRootNode->mChildren[i] = rootBones[i]->ConvertToAssimpNode(skeleton, dest->mRootNode);
            }
        }

        // Animations
        if (!skeleton->animations.empty())
        {
            dest->mNumAnimations = static_cast<unsigned int>(skeleton->animations.size());
            dest->mAnimations = new aiAnimation*[dest->mNumAnimations];

            for(size_t i=0, len=skeleton->animations.size(); i<len; ++i)
            {
                dest->mAnimations[i] = skeleton->animations[i]->ConvertToAssimpAnimation();
            }
        }
    }
}